

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmyblas2.c
# Opt level: O0

void zusolve(int ldm,int ncol,doublecomplex *M,doublecomplex *rhs)

{
  double ci;
  double cr;
  int local_48;
  int irow;
  int j;
  int jcol;
  doublecomplex temp;
  doublecomplex xj;
  doublecomplex *rhs_local;
  doublecomplex *M_local;
  int ncol_local;
  int ldm_local;
  
  irow = ncol + -1;
  for (local_48 = 0; local_48 < ncol; local_48 = local_48 + 1) {
    z_div((doublecomplex *)&temp.i,rhs + irow,M + (irow + irow * ldm));
    rhs[irow].r = temp.i;
    rhs[irow].i = xj.r;
    for (cr._4_4_ = 0; cr._4_4_ < irow; cr._4_4_ = cr._4_4_ + 1) {
      temp.r = xj.r * M[cr._4_4_ + irow * ldm].r + temp.i * M[cr._4_4_ + irow * ldm].i;
      rhs[cr._4_4_].r =
           rhs[cr._4_4_].r -
           (temp.i * M[cr._4_4_ + irow * ldm].r + -(xj.r * M[cr._4_4_ + irow * ldm].i));
      rhs[cr._4_4_].i = rhs[cr._4_4_].i - temp.r;
    }
    irow = irow + -1;
  }
  return;
}

Assistant:

void zusolve (int ldm, int ncol, doublecomplex *M, doublecomplex *rhs)
{
    doublecomplex xj, temp;
    int jcol, j, irow;

    jcol = ncol - 1;

    for (j = 0; j < ncol; j++) {

	z_div(&xj, &rhs[jcol], &M[jcol + jcol*ldm]); /* M(jcol, jcol) */
	rhs[jcol] = xj;
	
	for (irow = 0; irow < jcol; irow++) {
	    zz_mult(&temp, &xj, &M[irow+jcol*ldm]); /* M(irow, jcol) */
	    z_sub(&rhs[irow], &rhs[irow], &temp);
	}

	jcol--;

    }
}